

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

Vec_Int_t * Exp_And(int *pMan,int nVars,Vec_Int_t *p0,Vec_Int_t *p1,int fCompl0,int fCompl1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *p;
  int iVar6;
  int iVar7;
  undefined4 in_register_00000034;
  Vec_Int_t *p_00;
  int nCap;
  int iVar8;
  
  p_00 = (Vec_Int_t *)CONCAT44(in_register_00000034,nVars);
  uVar1 = p_00->nSize;
  uVar2 = p0->nSize;
  nCap = uVar2 + uVar1 + 1;
  p = Vec_IntAlloc(nCap);
  if ((uVar1 & uVar2 & 1) == 0) {
    __assert_fail("(Len0 & 1) && (Len1 & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                  ,0x8b,"Vec_Int_t *Exp_And(int *, int, Vec_Int_t *, Vec_Int_t *, int, int)");
  }
  Vec_IntPush(p,((int)uVar1 / 2 + (int)pMan + (int)uVar2 / 2) * 2);
  uVar3 = Vec_IntEntry(p_00,0);
  uVar3 = (uint)p1 ^ uVar3;
  iVar6 = (int)pMan * 2;
  iVar5 = ((int)uVar2 / 2) * 2;
  iVar8 = iVar5;
  if ((int)uVar3 < iVar6) {
    iVar8 = 0;
  }
  Vec_IntPush(p,iVar8 + uVar3);
  uVar3 = Vec_IntEntry(p0,0);
  Vec_IntPush(p,fCompl0 ^ uVar3);
  for (iVar8 = 1; iVar8 < (int)uVar1; iVar8 = iVar8 + 1) {
    iVar4 = Vec_IntEntry(p_00,iVar8);
    iVar7 = iVar5;
    if (iVar4 < iVar6) {
      iVar7 = 0;
    }
    Vec_IntPush(p,iVar7 + iVar4);
  }
  for (iVar6 = 1; iVar6 < (int)uVar2; iVar6 = iVar6 + 1) {
    iVar5 = Vec_IntEntry(p0,iVar6);
    Vec_IntPush(p,iVar5);
  }
  if (p->nSize == nCap) {
    return p;
  }
  __assert_fail("Vec_IntSize(r) == Len0 + Len1 + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                ,0x93,"Vec_Int_t *Exp_And(int *, int, Vec_Int_t *, Vec_Int_t *, int, int)");
}

Assistant:

static inline Vec_Int_t * Exp_And( int * pMan, int nVars, Vec_Int_t * p0, Vec_Int_t * p1, int fCompl0, int fCompl1 )
{
    int i, Len0 = Vec_IntSize(p0), Len1 = Vec_IntSize(p1);
    Vec_Int_t * r = Vec_IntAlloc( Len0 + Len1 + 1 );
    assert( (Len0 & 1) && (Len1 & 1) );
    Vec_IntPush( r, 2 * (nVars + Len0/2 + Len1/2) );
    Vec_IntPush( r, Exp_LitShift( nVars, Vec_IntEntry(p0, 0) ^ fCompl0, Len1/2 ) );
    Vec_IntPush( r, Vec_IntEntry(p1, 0) ^ fCompl1 );
    for ( i = 1; i < Len0; i++ )
        Vec_IntPush( r, Exp_LitShift( nVars, Vec_IntEntry(p0, i), Len1/2 ) );
    for ( i = 1; i < Len1; i++ )
        Vec_IntPush( r, Vec_IntEntry(p1, i) );
    assert( Vec_IntSize(r) == Len0 + Len1 + 1 );
    return r;
}